

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type1Test.cpp
# Opt level: O0

void ShowDoubleVector(vector<double,_std::allocator<double>_> *inVector)

{
  bool bVar1;
  reference inValue;
  char *pcVar2;
  ostream *poVar3;
  BoxingBaseWithRW<double,_STDStreamsReader<double>,_STDStreamsWriter<double>_> local_48;
  string local_40;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> local_20;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> local_18;
  const_iterator it;
  vector<double,_std::allocator<double>_> *inVector_local;
  
  it._M_current = (double *)inVector;
  local_18._M_current = (double *)std::vector<double,_std::allocator<double>_>::begin(inVector);
  std::operator<<((ostream *)&std::cout,"[ ");
  while( true ) {
    local_20._M_current = (double *)std::vector<double,_std::allocator<double>_>::end(it._M_current)
    ;
    bVar1 = __gnu_cxx::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    inValue = __gnu_cxx::
              __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
              operator*(&local_18);
    BoxingBaseWithRW<double,_STDStreamsReader<double>,_STDStreamsWriter<double>_>::BoxingBaseWithRW
              (&local_48,inValue);
    BoxingBaseWithRW<double,STDStreamsReader<double>,STDStreamsWriter<double>>::ToString_abi_cxx11_
              (&local_40,&local_48);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    poVar3 = std::operator<<((ostream *)&std::cout,pcVar2);
    std::operator<<(poVar3," ");
    std::__cxx11::string::~string((string *)&local_40);
    __gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&local_18);
  }
  std::operator<<((ostream *)&std::cout,"]");
  return;
}

Assistant:

static void ShowDoubleVector(const vector<double>& inVector)
{
	vector<double>::const_iterator it = inVector.begin();

	cout<<"[ ";
	for(;it != inVector.end();++it)
		cout<<Double(*it).ToString().c_str()<<" ";
	cout<<"]";	
}